

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O2

ParquetKeys * duckdb::ParquetKeys::Get(ClientContext *context)

{
  ObjectCache *this;
  type pPVar1;
  undefined1 local_78 [16];
  __node_base local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [3];
  undefined1 local_48 [16];
  string local_38;
  
  this = ObjectCache::GetObjectCache(context);
  ObjectType_abi_cxx11_();
  ObjectCache::Get<duckdb::ParquetKeys>((ObjectCache *)local_78,(string *)this);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  ::std::__cxx11::string::~string((string *)&local_68);
  if ((element_type *)local_78._0_8_ == (element_type *)0x0) {
    ObjectType_abi_cxx11_();
    make_shared_ptr<duckdb::ParquetKeys>();
    local_48._0_8_ = local_68._M_nxt;
    local_48._8_8_ = a_Stack_60[0]._M_pi;
    local_68._M_nxt = (_Hash_node_base *)0x0;
    a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ObjectCache::Put(this,&local_38,(shared_ptr<duckdb::ObjectCacheEntry,_true> *)local_48);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  ObjectType_abi_cxx11_();
  ObjectCache::Get<duckdb::ParquetKeys>((ObjectCache *)local_78,(string *)this);
  pPVar1 = shared_ptr<duckdb::ParquetKeys,_true>::operator*
                     ((shared_ptr<duckdb::ParquetKeys,_true> *)local_78);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  ::std::__cxx11::string::~string((string *)&local_68);
  return pPVar1;
}

Assistant:

ParquetKeys &ParquetKeys::Get(ClientContext &context) {
	auto &cache = ObjectCache::GetObjectCache(context);
	if (!cache.Get<ParquetKeys>(ParquetKeys::ObjectType())) {
		cache.Put(ParquetKeys::ObjectType(), make_shared_ptr<ParquetKeys>());
	}
	return *cache.Get<ParquetKeys>(ParquetKeys::ObjectType());
}